

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccnr.cc
# Opt level: O3

void __thiscall
CCNR::ls_solver::initialize(ls_solver *this,vector<char,_std::allocator<char>_> *init_solution)

{
  pointer pcVar1;
  pointer pcVar2;
  pointer pcVar3;
  pointer plVar4;
  size_t sVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  uint uVar9;
  ostream *poVar10;
  long lVar11;
  int *piVar12;
  pointer plVar13;
  ulong uVar14;
  ulong uVar15;
  int iVar16;
  ulong uVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  int iVar21;
  undefined1 auVar20 [16];
  
  clear_prev_data(this);
  if (init_solution == (vector<char,_std::allocator<char>_> *)0x0) {
    if (this->_num_vars == 0) goto LAB_0012cb6a;
    uVar14 = 1;
    do {
      do {
        uVar9 = Mersenne::next32(&this->_random_gen);
      } while ((int)((uVar9 >> 1) + 2) < 0);
      (this->_solution).super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_start[uVar14] = (byte)uVar9 >> 1 & 1;
      uVar14 = uVar14 + 1;
      uVar17 = this->_num_vars;
    } while (uVar14 <= uVar17);
  }
  else {
    pcVar1 = (init_solution->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pcVar2 = (init_solution->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if ((long)pcVar2 - (long)pcVar1 != this->_num_vars) {
LAB_0012cc27:
      poVar10 = std::operator<<((ostream *)&std::cout,
                                "c Error: the init solution\'s size is not equal to the number of variables."
                               );
      std::endl<char,std::char_traits<char>>(poVar10);
      exit(0);
    }
    if (pcVar2 == pcVar1) goto LAB_0012cb6a;
    uVar14 = 0;
    do {
      pcVar1 = (init_solution->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((ulong)((long)(init_solution->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                        super__Vector_impl_data._M_finish - (long)pcVar1) <= uVar14) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
        goto LAB_0012cc27;
      }
      (this->_solution).super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_start[uVar14 + 1] = pcVar1[uVar14];
      (this->_best_solution).super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_start[uVar14 + 1] =
           (this->_solution).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start[uVar14 + 1];
      uVar17 = this->_num_vars;
      uVar15 = uVar14 + 2;
      uVar14 = uVar14 + 1;
    } while (uVar15 <= uVar17);
  }
  auVar8 = _DAT_0012f060;
  auVar7 = _DAT_0012f050;
  auVar6 = _DAT_0012f020;
  if (uVar17 != 0) {
    lVar11 = uVar17 - 1;
    auVar18._8_4_ = (int)lVar11;
    auVar18._0_8_ = lVar11;
    auVar18._12_4_ = (int)((ulong)lVar11 >> 0x20);
    piVar12 = &(this->_vars).super__Vector_base<CCNR::variable,_std::allocator<CCNR::variable>_>.
               _M_impl.super__Vector_impl_data._M_start[4].unsat_appear;
    uVar14 = 0;
    auVar18 = auVar18 ^ _DAT_0012f060;
    do {
      auVar19._8_4_ = (int)uVar14;
      auVar19._0_8_ = uVar14;
      auVar19._12_4_ = (int)(uVar14 >> 0x20);
      auVar20 = (auVar19 | auVar6) ^ auVar8;
      iVar16 = auVar18._4_4_;
      if ((bool)(~(auVar20._4_4_ == iVar16 && auVar18._0_4_ < auVar20._0_4_ ||
                  iVar16 < auVar20._4_4_) & 1)) {
        piVar12[-0x36] = 0;
      }
      if ((auVar20._12_4_ != auVar18._12_4_ || auVar20._8_4_ <= auVar18._8_4_) &&
          auVar20._12_4_ <= auVar18._12_4_) {
        piVar12[-0x24] = 0;
      }
      auVar19 = (auVar19 | auVar7) ^ auVar8;
      iVar21 = auVar19._4_4_;
      if (iVar21 <= iVar16 && (iVar21 != iVar16 || auVar19._0_4_ <= auVar18._0_4_)) {
        piVar12[-0x12] = 0;
        *piVar12 = 0;
      }
      uVar14 = uVar14 + 4;
      piVar12 = piVar12 + 0x48;
    } while ((uVar17 + 3 & 0xfffffffffffffffc) != uVar14);
  }
LAB_0012cb6a:
  uVar14 = this->_num_clauses;
  if (uVar14 != 0) {
    uVar17 = 0;
    do {
      pcVar3 = (this->_clauses).super__Vector_base<CCNR::clause,_std::allocator<CCNR::clause>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pcVar3[uVar17].sat_count = 0;
      pcVar3[uVar17].sat_var = -1;
      pcVar3[uVar17].weight = 1;
      plVar13 = *(pointer *)
                 &pcVar3[uVar17].literals.super__Vector_base<CCNR::lit,_std::allocator<CCNR::lit>_>.
                  _M_impl;
      plVar4 = *(pointer *)
                ((long)&pcVar3[uVar17].literals.
                        super__Vector_base<CCNR::lit,_std::allocator<CCNR::lit>_>._M_impl + 8);
      if (plVar13 == plVar4) {
LAB_0012cbe0:
        unsat_a_clause(this,(int)uVar17);
        uVar14 = this->_num_clauses;
      }
      else {
        pcVar1 = (this->_solution).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar16 = 0;
        do {
          sVar5 = plVar13->var_num;
          if ((*(uint *)plVar13 & 1) == (int)pcVar1[sVar5]) {
            iVar16 = iVar16 + 1;
            pcVar3[uVar17].sat_count = iVar16;
            pcVar3[uVar17].sat_var = (int)sVar5;
          }
          plVar13 = plVar13 + 1;
        } while (plVar13 != plVar4);
        if (iVar16 == 0) goto LAB_0012cbe0;
      }
      uVar17 = uVar17 + 1;
    } while (uVar17 < uVar14);
  }
  this->_avg_clause_weight = 1;
  this->_delta_total_clause_weight = 0;
  initialize_variable_datas(this);
  return;
}

Assistant:

void ls_solver::initialize(const vector<char> *init_solution)
{
    size_t v, c;
    clear_prev_data();
    if (!init_solution) {
        // default random generation
        // cout<<"c using random initial solution"<<endl;
        for (v = 1; v <= _num_vars; v++) {
            _solution[v] = (_random_gen.next(2) == 0 ? 0 : 1);
        }
    } else {
        // cout<<"ok\n";
        if (init_solution->size() != _num_vars) {
            cout << "c Error: the init solution's size is not equal to the number of variables." << endl;
            exit(0);
        }
        for (v = 1; v <= _num_vars; v++) {
            _solution[v] = init_solution->at(v - 1);
            _best_solution[v] = _solution[v];
        }
        // cout<<"ok1\n";
    }
    // unsat_appears, will be updated when calling unsat_a_clause function.
    for (v = 1; v <= _num_vars; v++) {
        _vars[v].unsat_appear = 0;
    }
    // initialize data structure of clauses according to init solution
    for (c = 0; c < _num_clauses; c++) {
        _clauses[c].sat_count = 0;
        _clauses[c].sat_var = -1;
        _clauses[c].weight = 1;

        for (lit l : _clauses[c].literals) {
            if (_solution[l.var_num] == l.sense) {
                _clauses[c].sat_count++;
                _clauses[c].sat_var = l.var_num;
            }
        }
        if (0 == _clauses[c].sat_count) {
            unsat_a_clause(c);
        }
    }
    _avg_clause_weight = 1;
    _delta_total_clause_weight = 0;
    initialize_variable_datas();
}